

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall
aeron::ClientConductor::lingerAllResources(ClientConductor *this,longlong now,ImageList *imageList)

{
  long lVar1;
  ulong uVar2;
  longlong local_50;
  shared_ptr<aeron::LogBuffers> local_48;
  ImageList *local_38;
  
  if (imageList != (ImageList *)0x0) {
    if (imageList->m_length != 0) {
      lVar1 = 0xa8;
      uVar2 = 0;
      do {
        local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)((long)(imageList->m_images->m_termBuffers)._M_elems + lVar1 + -0x10)
        ;
        local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)(imageList->m_images->m_termBuffers)._M_elems + lVar1 + -8);
        if (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_50 = now;
        std::
        vector<aeron::ClientConductor::LogBuffersLingerDefn,std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>>
        ::emplace_back<long_long&,std::shared_ptr<aeron::LogBuffers>&>
                  ((vector<aeron::ClientConductor::LogBuffersLingerDefn,std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>>
                    *)&this->m_lingeringLogBuffers,&local_50,&local_48);
        if (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x128;
      } while (uVar2 < imageList->m_length);
    }
    local_50 = now;
    local_38 = imageList;
    std::
    vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
    ::emplace_back<long_long&,aeron::ImageList*&>
              ((vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
                *)&this->m_lingeringImageLists,&local_50,&local_38);
  }
  return;
}

Assistant:

void ClientConductor::lingerAllResources(long long now, struct ImageList *imageList)
{
    if (nullptr != imageList)
    {
        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            lingerResource(now, imageList->m_images[i].logBuffers());
        }

        lingerResource(now, imageList);
    }
}